

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.cpp
# Opt level: O0

void * __thiscall Span::malloc(Span *this,size_t __size)

{
  code *pcVar1;
  bool bVar2;
  int local_14;
  int i;
  Span *this_local;
  
  local_14 = 0;
  while( true ) {
    if (this->nelems <= local_14) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    bVar2 = BitMap::Get(&this->bitmap,local_14);
    if (!bVar2) break;
    local_14 = local_14 + 1;
  }
  BitMap::Set(&this->bitmap,local_14);
  this->allocCount = this->allocCount + 1;
  return (void *)((long)this->startAddr + (long)(this->elemsize * local_14));
}

Assistant:

void *Span::malloc() {
  for (int i = 0; i < nelems; i++) {
    if (bitmap.Get(i) == 0) {
      bitmap.Set(i);
      allocCount++;
      // 注意这个地址的计算要测试一下
      return (void *)((char *)startAddr + elemsize * i);
    }
  }
}